

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcCommon.h
# Opt level: O0

unsigned_long o3dgc::Insert(SC3DMCTriplet e,unsigned_long *nPred,SC3DMCPredictor *list)

{
  unsigned_long uVar1;
  bool bVar2;
  bool bVar3;
  SC3DMCPredictor *pSVar4;
  ulong local_38;
  unsigned_long h;
  unsigned_long j;
  unsigned_long uStack_20;
  bool foundOrInserted;
  unsigned_long pos;
  SC3DMCPredictor *list_local;
  unsigned_long *nPred_local;
  
  uStack_20 = 0xffffffff;
  bVar2 = false;
  h = 0;
  while( true ) {
    if (*nPred <= h) goto LAB_00951cc0;
    bVar3 = operator==(&e,&list[h].m_id);
    if (bVar3) {
      bVar2 = true;
      goto LAB_00951cc0;
    }
    bVar3 = operator<(&e,&list[h].m_id);
    if (bVar3) break;
    h = h + 1;
  }
  if (*nPred < 2) {
    *nPred = *nPred + 1;
  }
  uVar1 = *nPred;
  while (local_38 = uVar1 - 1, h < local_38) {
    memcpy(list + local_38,list + (uVar1 - 2),0x118);
    uVar1 = local_38;
  }
  pSVar4 = list + h;
  (pSVar4->m_id).m_a = e.m_a;
  (pSVar4->m_id).m_b = e.m_b;
  (pSVar4->m_id).m_c = e.m_c;
  uStack_20 = h;
  bVar2 = true;
LAB_00951cc0:
  if ((!bVar2) && (*nPred < 2)) {
    uStack_20 = *nPred;
    uVar1 = *nPred;
    *nPred = uVar1 + 1;
    pSVar4 = list + uVar1;
    (pSVar4->m_id).m_a = e.m_a;
    (pSVar4->m_id).m_b = e.m_b;
    (pSVar4->m_id).m_c = e.m_c;
  }
  return uStack_20;
}

Assistant:

inline unsigned long Insert(SC3DMCTriplet e, unsigned long & nPred, SC3DMCPredictor * const list)
    {
        unsigned long pos = 0xFFFFFFFF;
        bool foundOrInserted = false;
        for (unsigned long j = 0; j < nPred; ++j)
        {
            if (e == list[j].m_id)
            {
                foundOrInserted = true;
                break;
            }
            else if (e < list[j].m_id)
            {
                if (nPred < O3DGC_SC3DMC_MAX_PREDICTION_NEIGHBORS)
                {
                    ++nPred;
                }
                for (unsigned long h = nPred-1; h > j; --h)
                {
                    list[h] = list[h-1];
                }
                list[j].m_id = e;
                pos = j;
                foundOrInserted = true;
                break;
            }
        }
        if (!foundOrInserted && nPred < O3DGC_SC3DMC_MAX_PREDICTION_NEIGHBORS)
        {
            pos = nPred;
            list[nPred++].m_id = e;
        }
        return pos;
    }